

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64rapass.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::a64::RACFGBuilder::onInvoke
          (RACFGBuilder *this,InvokeNode *invokeNode,RAInstBuilder *ib)

{
  byte bVar1;
  undefined4 uVar2;
  bool bVar3;
  byte bVar4;
  Error EVar5;
  uint uVar6;
  RegMask RVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  FuncValue *pFVar15;
  uint32_t *puVar16;
  long in_RSI;
  Error _err_4;
  RegGroup retGroup;
  RegGroup regGroup_2;
  Error _err_3;
  RAWorkReg *workReg_1;
  Reg *reg_1;
  Operand *op_1;
  FuncValue *ret;
  uint32_t retIndex;
  Error _err_2;
  RegGroup argGroup;
  RegGroup regGroup_1;
  Error _err_1;
  RegGroup regGroup;
  Error _err;
  RAWorkReg *workReg;
  Reg *reg;
  Operand *op;
  FuncValue *arg;
  uint32_t valueIndex;
  FuncValuePack *argPack;
  uint32_t argIndex;
  FuncDetail *fd;
  uint32_t argCount;
  undefined4 in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffccc;
  undefined4 in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd4;
  RegGroup group;
  undefined4 in_stack_fffffffffffffcd8;
  uint32_t in_stack_fffffffffffffcdc;
  undefined4 in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce4;
  uint32_t in_stack_fffffffffffffd14;
  undefined2 in_stack_fffffffffffffd18;
  undefined1 in_stack_fffffffffffffd1a;
  undefined1 in_stack_fffffffffffffd1b;
  undefined4 in_stack_fffffffffffffd1c;
  RAInstBuilder *in_stack_fffffffffffffd20;
  uint local_2c0;
  long local_2a8;
  uint local_284;
  uint local_274;
  undefined4 local_1cc;
  Operand *local_1c8;
  FuncValue *local_1c0;
  FuncValue *local_1b8;
  undefined1 local_1aa;
  undefined1 local_1a9;
  FuncValue *local_1a8;
  FuncValue *local_1a0;
  ulong local_198;
  long local_190;
  ulong local_188;
  FuncValue *local_178;
  FuncValue *local_170;
  FuncValue *local_168;
  FuncValue *local_160;
  byte *local_158;
  byte *local_150;
  byte *local_148;
  byte *local_140;
  undefined1 local_131;
  long local_130;
  undefined1 local_121;
  long local_120;
  undefined1 local_111;
  long local_110;
  undefined1 local_101;
  long local_100;
  undefined1 local_f2;
  undefined1 local_f1;
  Operand *local_f0;
  Operand *local_e8;
  Operand *local_e0;
  Operand *local_d8;
  Operand *local_d0;
  Operand *local_c8;
  uint *local_c0;
  undefined4 *local_b8;
  RAInstBuilder *local_b0;
  RAInstBuilder *local_a8;
  undefined4 *local_a0;
  uint *local_98;
  long local_90;
  undefined4 *local_88;
  Operand *local_80;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_6c;
  FuncValue *local_68;
  undefined4 local_5c;
  FuncValue *local_58;
  undefined4 local_4c;
  FuncValue *local_48;
  undefined1 local_39;
  undefined8 local_38;
  OperandSignature *local_30;
  OperandSignature *local_28;
  undefined1 local_19;
  undefined8 local_18;
  OperandSignature *local_10;
  OperandSignature *local_8;
  
  local_90 = in_RSI + 0x80;
  bVar1 = *(byte *)(in_RSI + 0xf4);
  lVar14 = in_RSI + 0x80;
  for (local_274 = 0; local_274 < bVar1; local_274 = local_274 + 1) {
    FuncDetail::argPack((FuncDetail *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                        CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    for (local_284 = 0; local_284 < 4; local_284 = local_284 + 1) {
      pFVar15 = FuncValuePack::operator[]
                          ((FuncValuePack *)
                           CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                           CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      if (pFVar15->_data != 0) {
        pFVar15 = FuncValuePack::operator[]
                            ((FuncValuePack *)
                             CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                             CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
        local_1c8 = InvokeNode::arg((InvokeNode *)
                                    CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                                    CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                                    CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
        local_74 = 0;
        local_70 = 0;
        local_1cc = 0;
        local_88 = &local_1cc;
        local_80 = local_1c8;
        if (((local_1c8->super_Operand_)._signature._bits != 0) &&
           (local_f0 = local_1c8, local_d8 = local_1c8, local_d0 = local_1c8,
           ((local_1c8->super_Operand_)._signature._bits & 7) == 1)) {
          EVar5 = BaseRAPass::virtIndexAsWorkReg
                            ((BaseRAPass *)
                             CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                             in_stack_fffffffffffffcdc,
                             (RAWorkReg **)
                             CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
          if (EVar5 != 0) {
            return EVar5;
          }
          local_6c = 0x400;
          local_178 = pFVar15;
          local_68 = pFVar15;
          bVar3 = Support::test<unsigned_int,unsigned_int>(pFVar15->_data,0x400);
          if (bVar3) {
            local_c0 = (uint *)(local_2a8 + 0x20);
            local_98 = local_c0;
            if ((*local_c0 & 0xf00) != 0) {
              EVar5 = DebugUtils::errored(3);
              return EVar5;
            }
            local_160 = pFVar15;
            EVar5 = RAInstBuilder::addCallArg
                              (in_stack_fffffffffffffd20,
                               (RAWorkReg *)
                               CONCAT44(in_stack_fffffffffffffd1c,
                                        CONCAT13(in_stack_fffffffffffffd1b,
                                                 CONCAT12(in_stack_fffffffffffffd1a,
                                                          in_stack_fffffffffffffd18))),
                               in_stack_fffffffffffffd14);
joined_r0x0019f004:
            if (EVar5 != 0) {
              return EVar5;
            }
          }
          else {
            local_5c = 0x100;
            local_1b8 = pFVar15;
            local_58 = pFVar15;
            bVar3 = Support::test<unsigned_int,unsigned_int>(pFVar15->_data,0x100);
            if (bVar3) {
              local_b8 = (undefined4 *)(local_2a8 + 0x20);
              uVar2 = *local_b8;
              local_1a9 = (undefined1)(pFVar15->_data >> 0x18);
              local_f2 = 6;
              local_38 = 0x1fe510;
              local_1a0 = pFVar15;
              local_a0 = local_b8;
              local_39 = local_1a9;
              local_30 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                         operator[]<asmjit::v1_14::RegType>
                                   ((Array<asmjit::v1_14::OperandSignature,_32UL> *)
                                    CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                                    (RegType *)
                                    CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
              local_28 = local_30;
              if (((byte)((uint)uVar2 >> 8) & 0xf) == ((byte)(local_30->_bits >> 8) & 0xf)) {
                local_168 = pFVar15;
                EVar5 = RAInstBuilder::addCallArg
                                  (in_stack_fffffffffffffd20,
                                   (RAWorkReg *)
                                   CONCAT44(in_stack_fffffffffffffd1c,
                                            CONCAT13(in_stack_fffffffffffffd1b,
                                                     CONCAT12(in_stack_fffffffffffffd1a,
                                                              in_stack_fffffffffffffd18))),
                                   in_stack_fffffffffffffd14);
                goto joined_r0x0019f004;
              }
            }
          }
        }
      }
    }
  }
  for (local_2c0 = 0; local_2c0 < 4; local_2c0 = local_2c0 + 1) {
    local_198 = (ulong)local_2c0;
    local_190 = lVar14;
    pFVar15 = FuncValuePack::operator[]
                        ((FuncValuePack *)
                         CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                         CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    if (pFVar15->_data == 0) break;
    local_188 = (ulong)local_2c0;
    local_e8 = InvokeNode::OperandPack::operator[]
                         ((OperandPack *)
                          CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                          CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
    local_e0 = local_e8;
    local_c8 = local_e8;
    if (((local_e8->super_Operand_)._signature._bits & 7) == 1) {
      EVar5 = BaseRAPass::virtIndexAsWorkReg
                        ((BaseRAPass *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0)
                         ,in_stack_fffffffffffffcdc,
                         (RAWorkReg **)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0)
                        );
      if (EVar5 != 0) {
        return EVar5;
      }
      local_4c = 0x100;
      local_1c0 = pFVar15;
      local_48 = pFVar15;
      bVar3 = Support::test<unsigned_int,unsigned_int>(pFVar15->_data,0x100);
      if (!bVar3) {
        EVar5 = DebugUtils::errored(0x19);
        return EVar5;
      }
      local_b0 = in_stack_fffffffffffffd20 + 0x20;
      bVar4 = (byte)((uint)*(undefined4 *)local_b0 >> 8) & 0xf;
      local_1aa = (undefined1)(pFVar15->_data >> 0x18);
      local_f1 = 6;
      local_18 = 0x1fe510;
      local_1a8 = pFVar15;
      local_a8 = local_b0;
      local_19 = local_1aa;
      local_10 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                 operator[]<asmjit::v1_14::RegType>
                           ((Array<asmjit::v1_14::OperandSignature,_32UL> *)
                            CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                            (RegType *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8)
                           );
      bVar1 = (byte)(local_10->_bits >> 8);
      local_8 = local_10;
      if (bVar4 == (bVar1 & 0xf)) {
        local_170 = pFVar15;
        EVar5 = RAInstBuilder::addCallRet
                          (in_stack_fffffffffffffd20,
                           (RAWorkReg *)
                           (CONCAT44(EVar5,CONCAT13(bVar4,CONCAT12(bVar1,in_stack_fffffffffffffd18))
                                    ) & 0xffffffffff0fffff),in_stack_fffffffffffffd14);
        if (EVar5 != 0) {
          return EVar5;
        }
        in_stack_fffffffffffffd14 = 0;
      }
    }
  }
  local_140 = RARegCount::operator[]
                        ((RARegCount *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8)
                         ,(RegGroup)((uint)in_stack_fffffffffffffcd4 >> 0x18));
  uVar6 = (int)(1L << (*local_140 & 0x3f)) - 1;
  local_101 = 0;
  local_100 = lVar14;
  RVar7 = CallConv::preservedRegs
                    ((CallConv *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                     (RegGroup)((uint)in_stack_fffffffffffffcd4 >> 0x18));
  uVar8 = uVar6 & (RVar7 ^ 0xffffffff);
  puVar16 = RARegMask::operator[]<int>
                      ((RARegMask *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                       (int *)CONCAT44(uVar8,uVar6));
  *puVar16 = uVar8;
  group = (RegGroup)((uint)in_stack_fffffffffffffcd4 >> 0x18);
  local_148 = RARegCount::operator[]
                        ((RARegCount *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8)
                         ,group);
  uVar9 = (int)(1L << (*local_148 & 0x3f)) - 1;
  local_111 = 1;
  local_110 = lVar14;
  RVar7 = CallConv::preservedRegs
                    ((CallConv *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),group
                    );
  uVar10 = uVar9 & (RVar7 ^ 0xffffffff);
  puVar16 = RARegMask::operator[]<int>
                      ((RARegMask *)CONCAT44(uVar10,uVar9),(int *)CONCAT44(uVar8,uVar6));
  *puVar16 = uVar10;
  local_150 = RARegCount::operator[]
                        ((RARegCount *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8)
                         ,(RegGroup)(uVar10 >> 0x18));
  uVar11 = (int)(1L << (*local_150 & 0x3f)) - 1;
  local_121 = 2;
  local_120 = lVar14;
  RVar7 = CallConv::preservedRegs
                    ((CallConv *)CONCAT44(in_stack_fffffffffffffcdc,uVar11),
                     (RegGroup)(uVar10 >> 0x18));
  uVar12 = uVar11 & (RVar7 ^ 0xffffffff);
  puVar16 = RARegMask::operator[]<int>
                      ((RARegMask *)CONCAT44(uVar10,uVar9),(int *)CONCAT44(uVar8,uVar6));
  *puVar16 = uVar12;
  local_158 = RARegCount::operator[]
                        ((RARegCount *)CONCAT44(uVar12,uVar11),(RegGroup)(uVar10 >> 0x18));
  uVar13 = (int)(1L << (*local_158 & 0x3f)) - 1;
  local_131 = 3;
  local_130 = lVar14;
  RVar7 = CallConv::preservedRegs((CallConv *)CONCAT44(uVar12,uVar11),(RegGroup)(uVar10 >> 0x18));
  uVar13 = uVar13 & (RVar7 ^ 0xffffffff);
  puVar16 = RARegMask::operator[]<int>
                      ((RARegMask *)CONCAT44(uVar10,uVar9),(int *)CONCAT44(uVar8,uVar6));
  *puVar16 = uVar13;
  return 0;
}

Assistant:

Error RACFGBuilder::onInvoke(InvokeNode* invokeNode, RAInstBuilder& ib) noexcept {
  uint32_t argCount = invokeNode->argCount();
  const FuncDetail& fd = invokeNode->detail();

  for (uint32_t argIndex = 0; argIndex < argCount; argIndex++) {
    const FuncValuePack& argPack = fd.argPack(argIndex);
    for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
      if (!argPack[valueIndex])
        continue;

      const FuncValue& arg = argPack[valueIndex];
      const Operand& op = invokeNode->arg(argIndex, valueIndex);

      if (op.isNone())
        continue;

      if (op.isReg()) {
        const Reg& reg = op.as<Reg>();
        RAWorkReg* workReg;
        ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(Operand::virtIdToIndex(reg.id()), &workReg));

        if (arg.isIndirect()) {
          RegGroup regGroup = workReg->group();
          if (regGroup != RegGroup::kGp)
            return DebugUtils::errored(kErrorInvalidState);
          ASMJIT_PROPAGATE(ib.addCallArg(workReg, arg.regId()));
        }
        else if (arg.isReg()) {
          RegGroup regGroup = workReg->group();
          RegGroup argGroup = Reg::groupOf(arg.regType());

          if (regGroup == argGroup) {
            ASMJIT_PROPAGATE(ib.addCallArg(workReg, arg.regId()));
          }
        }
      }
    }
  }

  for (uint32_t retIndex = 0; retIndex < Globals::kMaxValuePack; retIndex++) {
    const FuncValue& ret = fd.ret(retIndex);
    if (!ret)
      break;

    const Operand& op = invokeNode->ret(retIndex);
    if (op.isReg()) {
      const Reg& reg = op.as<Reg>();
      RAWorkReg* workReg;
      ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(Operand::virtIdToIndex(reg.id()), &workReg));

      if (ret.isReg()) {
        RegGroup regGroup = workReg->group();
        RegGroup retGroup = Reg::groupOf(ret.regType());

        if (regGroup == retGroup) {
          ASMJIT_PROPAGATE(ib.addCallRet(workReg, ret.regId()));
        }
      }
      else {
        return DebugUtils::errored(kErrorInvalidAssignment);
      }
    }
  }

  // Setup clobbered registers.
  ib._clobbered[0] = Support::lsbMask<RegMask>(_pass->_physRegCount[RegGroup(0)]) & ~fd.preservedRegs(RegGroup(0));
  ib._clobbered[1] = Support::lsbMask<RegMask>(_pass->_physRegCount[RegGroup(1)]) & ~fd.preservedRegs(RegGroup(1));
  ib._clobbered[2] = Support::lsbMask<RegMask>(_pass->_physRegCount[RegGroup(2)]) & ~fd.preservedRegs(RegGroup(2));
  ib._clobbered[3] = Support::lsbMask<RegMask>(_pass->_physRegCount[RegGroup(3)]) & ~fd.preservedRegs(RegGroup(3));

  return kErrorOk;
}